

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O0

Smf * rlib::midi::Smf::fromStream(istream *is)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  streamoff sVar4;
  uint64_t uVar5;
  byte *pbVar6;
  ostream *poVar7;
  uchar *puVar8;
  long lVar9;
  size_type sVar10;
  char *in_RSI;
  Smf *in_RDI;
  fpos<__mbstate_t> fVar11;
  HeaderChunk HVar12;
  exception *e;
  streamsize readed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  uint64_t len;
  uint8_t type;
  uint8_t n_3;
  int i_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint64_t size;
  uint8_t n_2;
  int n_1;
  array<unsigned_char,_2UL> a_4;
  uint8_t n;
  array<unsigned_char,_2UL> a_3;
  array<unsigned_char,_2UL> a_2;
  array<unsigned_char,_2UL> a_1;
  array<unsigned_char,_2UL> a;
  uint8_t status;
  anon_class_8_1_3fcf65e8 readVariableValue;
  pos_type beginPosition;
  uint8_t beforeStatus;
  uint64_t currentPosition;
  Track track;
  TrackChunk trackChunk;
  size_t i;
  exception_ptr ep;
  HeaderChunk headerChunk;
  Smf *smf;
  shared_ptr<rlib::midi::EventChannelPressure> *in_stack_fffffffffffffb18;
  exception_ptr *in_stack_fffffffffffffb20;
  anon_class_16_2_ee112240 *in_stack_fffffffffffffb28;
  istream *in_stack_fffffffffffffb30;
  anon_class_8_1_3fcf65e8 *in_stack_fffffffffffffb38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb40;
  exception_ptr eVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb48;
  iterator in_stack_fffffffffffffb50;
  int *in_stack_fffffffffffffb58;
  ostream *in_stack_fffffffffffffb60;
  undefined1 local_2c8 [16];
  _Base_ptr local_2b8;
  uint local_2ac;
  long local_298;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  uint64_t local_270;
  byte local_261;
  _Base_ptr local_260;
  byte local_245;
  int local_244;
  uint64_t local_228;
  _Base_ptr local_220;
  uint local_218;
  uint local_214;
  byte local_1f9;
  _Base_ptr local_1f8;
  uint local_1ec;
  int local_1d8;
  _Type local_1d2;
  _Base_ptr local_1d0;
  uint local_1c8;
  uint local_1c4;
  byte local_1a9;
  _Base_ptr local_1a8;
  uint local_19c;
  uint local_198;
  uint local_194;
  _Type local_17a;
  _Base_ptr local_178;
  uint local_16c;
  uint local_168;
  uint local_164;
  _Type local_14a;
  _Base_ptr local_148;
  uint local_13c;
  uint local_138;
  uint local_134;
  _Type local_11a;
  _Base_ptr local_118;
  uint local_10c;
  uint local_108;
  uint local_104;
  _Type local_ea;
  char *local_e8;
  undefined1 *local_e0;
  byte local_d1;
  char *local_d0;
  fpos<__mbstate_t> local_c8;
  fpos<__mbstate_t> local_b8;
  undefined1 local_a1;
  long local_a0;
  int local_98 [12];
  char *local_68;
  TrackChunk local_60;
  ulong local_58;
  exception_ptr local_50;
  undefined8 local_48;
  undefined4 local_40;
  ushort local_3c;
  char *local_28;
  undefined8 local_1f;
  undefined4 local_17;
  ushort local_13;
  byte local_11;
  char *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  Smf((Smf *)0x1df497);
  local_28 = local_10;
  HVar12 = fromStream::anon_class_8_1_3fcf65e8::operator()
                     ((anon_class_8_1_3fcf65e8 *)in_stack_fffffffffffffb60);
  local_48 = HVar12._0_8_;
  local_40 = HVar12._8_4_;
  local_3c = HVar12.division;
  in_RDI->timeBase = (uint)local_3c;
  local_1f = local_48;
  local_17 = local_40;
  local_13 = local_3c;
  std::__exception_ptr::exception_ptr::exception_ptr(&local_50);
  local_58 = 0;
  do {
    if (local_17._2_2_ <= local_58) {
      while( true ) {
        bVar3 = std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_50);
        if (!bVar3) break;
        eVar13._M_exception_object = local_2c8;
        std::__exception_ptr::exception_ptr::exception_ptr
                  (in_stack_fffffffffffffb20,(exception_ptr *)in_stack_fffffffffffffb18);
        std::rethrow_exception(eVar13);
      }
      local_11 = 1;
      std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_fffffffffffffb20);
      if ((local_11 & 1) == 0) {
        ~Smf((Smf *)0x1e074b);
      }
      return in_RDI;
    }
    local_68 = local_10;
    local_60 = fromStream::anon_class_8_1_3fcf65e8::operator()(in_stack_fffffffffffffb38);
    Track::Track((Track *)0x1df5a9);
    local_a0 = 0;
    local_a1 = 0;
    fVar11 = (fpos<__mbstate_t>)std::istream::tellg();
    local_b8 = fVar11;
    while( true ) {
      fVar11 = (fpos<__mbstate_t>)std::istream::tellg();
      local_c8 = fVar11;
      sVar4 = std::fpos<__mbstate_t>::operator-(&local_c8,&local_b8);
      if ((long)((ulong)local_60 >> 0x20) <= sVar4) break;
      local_d0 = local_10;
      uVar5 = fromStream::anon_class_8_1_3fcf65e8::operator()
                        ((anon_class_8_1_3fcf65e8 *)in_stack_fffffffffffffb60);
      local_a0 = local_a0 + uVar5;
      local_e8 = local_10;
      local_e0 = &local_a1;
      local_d1 = fromStream::anon_class_16_2_ee112240::operator()(in_stack_fffffffffffffb28);
      bVar2 = local_d1 & 0xf0;
      if (bVar2 == 0x80) {
        local_ea = (_Type)Inner::read<std::array<unsigned_char,2ul>const>
                                    ((istream *)in_stack_fffffffffffffb28);
        local_104 = local_d1 & 0xf;
        pbVar6 = std::array<unsigned_char,_2UL>::operator[]
                           ((array<unsigned_char,_2UL> *)in_stack_fffffffffffffb20,
                            (size_type)in_stack_fffffffffffffb18);
        local_108 = *pbVar6 & 0x7f;
        pbVar6 = std::array<unsigned_char,_2UL>::operator[]
                           ((array<unsigned_char,_2UL> *)in_stack_fffffffffffffb20,
                            (size_type)in_stack_fffffffffffffb18);
        local_10c = *pbVar6 & 0x7f;
        std::make_shared<rlib::midi::EventNoteOff,int,int,int>
                  (in_stack_fffffffffffffb58,(int *)in_stack_fffffffffffffb50._M_node,
                   (int *)in_stack_fffffffffffffb48);
        local_118 = (_Base_ptr)
                    std::
                    multiset<rlib::midi::Smf::Event,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    ::emplace<unsigned_long&,std::shared_ptr<rlib::midi::EventNoteOff>>
                              ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                                *)in_stack_fffffffffffffb28,
                               (unsigned_long *)in_stack_fffffffffffffb20,
                               (shared_ptr<rlib::midi::EventNoteOff> *)in_stack_fffffffffffffb18);
        std::shared_ptr<rlib::midi::EventNoteOff>::~shared_ptr
                  ((shared_ptr<rlib::midi::EventNoteOff> *)0x1df8d6);
      }
      else if (bVar2 == 0x90) {
        local_11a = (_Type)Inner::read<std::array<unsigned_char,2ul>const>
                                     ((istream *)in_stack_fffffffffffffb28);
        local_134 = local_d1 & 0xf;
        pbVar6 = std::array<unsigned_char,_2UL>::operator[]
                           ((array<unsigned_char,_2UL> *)in_stack_fffffffffffffb20,
                            (size_type)in_stack_fffffffffffffb18);
        local_138 = *pbVar6 & 0x7f;
        pbVar6 = std::array<unsigned_char,_2UL>::operator[]
                           ((array<unsigned_char,_2UL> *)in_stack_fffffffffffffb20,
                            (size_type)in_stack_fffffffffffffb18);
        local_13c = *pbVar6 & 0x7f;
        std::make_shared<rlib::midi::EventNoteOn,int,int,int>
                  (in_stack_fffffffffffffb58,(int *)in_stack_fffffffffffffb50._M_node,
                   (int *)in_stack_fffffffffffffb48);
        local_148 = (_Base_ptr)
                    std::
                    multiset<rlib::midi::Smf::Event,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    ::emplace<unsigned_long&,std::shared_ptr<rlib::midi::EventNoteOn>>
                              ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                                *)in_stack_fffffffffffffb28,
                               (unsigned_long *)in_stack_fffffffffffffb20,
                               (shared_ptr<rlib::midi::EventNoteOn> *)in_stack_fffffffffffffb18);
        std::shared_ptr<rlib::midi::EventNoteOn>::~shared_ptr
                  ((shared_ptr<rlib::midi::EventNoteOn> *)0x1df9fa);
      }
      else if (bVar2 == 0xa0) {
        local_14a = (_Type)Inner::read<std::array<unsigned_char,2ul>const>
                                     ((istream *)in_stack_fffffffffffffb28);
        local_164 = local_d1 & 0xf;
        pbVar6 = std::array<unsigned_char,_2UL>::operator[]
                           ((array<unsigned_char,_2UL> *)in_stack_fffffffffffffb20,
                            (size_type)in_stack_fffffffffffffb18);
        local_168 = *pbVar6 & 0x7f;
        pbVar6 = std::array<unsigned_char,_2UL>::operator[]
                           ((array<unsigned_char,_2UL> *)in_stack_fffffffffffffb20,
                            (size_type)in_stack_fffffffffffffb18);
        local_16c = *pbVar6 & 0x7f;
        std::make_shared<rlib::midi::EventPolyphonicKeyPressure,int,int,int>
                  (in_stack_fffffffffffffb58,(int *)in_stack_fffffffffffffb50._M_node,
                   (int *)in_stack_fffffffffffffb48);
        local_178 = (_Base_ptr)
                    std::
                    multiset<rlib::midi::Smf::Event,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    ::
                    emplace<unsigned_long&,std::shared_ptr<rlib::midi::EventPolyphonicKeyPressure>>
                              ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                                *)in_stack_fffffffffffffb28,
                               (unsigned_long *)in_stack_fffffffffffffb20,
                               (shared_ptr<rlib::midi::EventPolyphonicKeyPressure> *)
                               in_stack_fffffffffffffb18);
        std::shared_ptr<rlib::midi::EventPolyphonicKeyPressure>::~shared_ptr
                  ((shared_ptr<rlib::midi::EventPolyphonicKeyPressure> *)0x1dfb1e);
      }
      else if (bVar2 == 0xb0) {
        local_17a = (_Type)Inner::read<std::array<unsigned_char,2ul>const>
                                     ((istream *)in_stack_fffffffffffffb28);
        local_194 = local_d1 & 0xf;
        pbVar6 = std::array<unsigned_char,_2UL>::operator[]
                           ((array<unsigned_char,_2UL> *)in_stack_fffffffffffffb20,
                            (size_type)in_stack_fffffffffffffb18);
        local_198 = *pbVar6 & 0x7f;
        pbVar6 = std::array<unsigned_char,_2UL>::operator[]
                           ((array<unsigned_char,_2UL> *)in_stack_fffffffffffffb20,
                            (size_type)in_stack_fffffffffffffb18);
        local_19c = *pbVar6 & 0x7f;
        std::make_shared<rlib::midi::EventControlChange,int,int,int>
                  (in_stack_fffffffffffffb58,(int *)in_stack_fffffffffffffb50._M_node,
                   (int *)in_stack_fffffffffffffb48);
        local_1a8 = (_Base_ptr)
                    std::
                    multiset<rlib::midi::Smf::Event,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    ::emplace<unsigned_long&,std::shared_ptr<rlib::midi::EventControlChange>>
                              ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                                *)in_stack_fffffffffffffb28,
                               (unsigned_long *)in_stack_fffffffffffffb20,
                               (shared_ptr<rlib::midi::EventControlChange> *)
                               in_stack_fffffffffffffb18);
        std::shared_ptr<rlib::midi::EventControlChange>::~shared_ptr
                  ((shared_ptr<rlib::midi::EventControlChange> *)0x1dfc42);
      }
      else if (bVar2 == 0xc0) {
        local_1a9 = Inner::read<unsigned_char_const>(in_stack_fffffffffffffb30);
        local_1c4 = local_d1 & 0xf;
        local_1c8 = local_1a9 & 0x7f;
        std::make_shared<rlib::midi::EventProgramChange,int,int>
                  ((int *)in_stack_fffffffffffffb48,(int *)in_stack_fffffffffffffb40);
        local_1d0 = (_Base_ptr)
                    std::
                    multiset<rlib::midi::Smf::Event,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    ::emplace<unsigned_long&,std::shared_ptr<rlib::midi::EventProgramChange>>
                              ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                                *)in_stack_fffffffffffffb28,
                               (unsigned_long *)in_stack_fffffffffffffb20,
                               (shared_ptr<rlib::midi::EventProgramChange> *)
                               in_stack_fffffffffffffb18);
        std::shared_ptr<rlib::midi::EventProgramChange>::~shared_ptr
                  ((shared_ptr<rlib::midi::EventProgramChange> *)0x1dfd28);
      }
      else if (bVar2 == 0xd0) {
        local_1f9 = Inner::read<unsigned_char_const>(in_stack_fffffffffffffb30);
        local_214 = local_d1 & 0xf;
        local_218 = local_1f9 & 0x7f;
        std::make_shared<rlib::midi::EventChannelPressure,int,int>
                  ((int *)in_stack_fffffffffffffb48,(int *)in_stack_fffffffffffffb40);
        local_220 = (_Base_ptr)
                    std::
                    multiset<rlib::midi::Smf::Event,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    ::emplace<unsigned_long&,std::shared_ptr<rlib::midi::EventChannelPressure>>
                              ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                                *)in_stack_fffffffffffffb28,
                               (unsigned_long *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18)
        ;
        std::shared_ptr<rlib::midi::EventChannelPressure>::~shared_ptr
                  ((shared_ptr<rlib::midi::EventChannelPressure> *)0x1dff3f);
      }
      else if (bVar2 == 0xe0) {
        local_1d2 = (_Type)Inner::read<std::array<unsigned_char,2ul>const>
                                     ((istream *)in_stack_fffffffffffffb28);
        pbVar6 = std::array<unsigned_char,_2UL>::operator[]
                           ((array<unsigned_char,_2UL> *)in_stack_fffffffffffffb20,
                            (size_type)in_stack_fffffffffffffb18);
        bVar2 = *pbVar6;
        pbVar6 = std::array<unsigned_char,_2UL>::operator[]
                           ((array<unsigned_char,_2UL> *)in_stack_fffffffffffffb20,
                            (size_type)in_stack_fffffffffffffb18);
        local_1d8 = ((bVar2 & 0x7f) - 0x2000) + (*pbVar6 & 0x7f) * 0x80;
        local_1ec = local_d1 & 0xf;
        std::make_shared<rlib::midi::EventPitchBend,int,int_const&>
                  ((int *)in_stack_fffffffffffffb48,(int *)in_stack_fffffffffffffb40);
        local_1f8 = (_Base_ptr)
                    std::
                    multiset<rlib::midi::Smf::Event,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    ::emplace<unsigned_long&,std::shared_ptr<rlib::midi::EventPitchBend>>
                              ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                                *)in_stack_fffffffffffffb28,
                               (unsigned_long *)in_stack_fffffffffffffb20,
                               (shared_ptr<rlib::midi::EventPitchBend> *)in_stack_fffffffffffffb18);
        std::shared_ptr<rlib::midi::EventPitchBend>::~shared_ptr
                  ((shared_ptr<rlib::midi::EventPitchBend> *)0x1dfe59);
      }
      else if (local_d1 == 0xf0) {
        local_228 = fromStream::anon_class_8_1_3fcf65e8::operator()
                              ((anon_class_8_1_3fcf65e8 *)in_stack_fffffffffffffb60);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1dffcd);
        for (local_244 = 0; (ulong)(long)local_244 < local_228; local_244 = local_244 + 1) {
          local_245 = Inner::read<unsigned_char_const>(in_stack_fffffffffffffb30);
          if (local_245 == 0xf7) {
            if ((long)local_244 != local_228 - 1) {
              poVar7 = std::operator<<((ostream *)&std::clog,
                                       "[warning] exclusive size error. EOX(0xf7) is failed position."
                                      );
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
            break;
          }
          if ((local_245 & 0x80) != 0) {
            poVar7 = std::operator<<((ostream *)&std::clog,
                                     "[warning] exclusive data error. EOX(0xf7) is missing.");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            break;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffb30,(value_type_conflict2 *)in_stack_fffffffffffffb28);
        }
        std::
        make_shared<rlib::midi::EventExclusive,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (in_stack_fffffffffffffb48);
        local_260 = (_Base_ptr)
                    std::
                    multiset<rlib::midi::Smf::Event,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    ::emplace<unsigned_long&,std::shared_ptr<rlib::midi::EventExclusive>>
                              ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                                *)in_stack_fffffffffffffb28,
                               (unsigned_long *)in_stack_fffffffffffffb20,
                               (shared_ptr<rlib::midi::EventExclusive> *)in_stack_fffffffffffffb18);
        std::shared_ptr<rlib::midi::EventExclusive>::~shared_ptr
                  ((shared_ptr<rlib::midi::EventExclusive> *)0x1e016e);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb30);
      }
      else if (local_d1 == 0xff) {
        local_261 = Inner::read<unsigned_char_const>(in_stack_fffffffffffffb30);
        local_270 = fromStream::anon_class_8_1_3fcf65e8::operator()
                              ((anon_class_8_1_3fcf65e8 *)in_stack_fffffffffffffb60);
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1e0223);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (in_stack_fffffffffffffb40,(size_type)in_stack_fffffffffffffb38,
                   (allocator_type *)in_stack_fffffffffffffb30);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1e024f);
        pcVar1 = local_10;
        puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e026e);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_288);
        std::istream::read(pcVar1,(long)puVar8);
        lVar9 = std::istream::gcount();
        local_298 = lVar9;
        sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_288);
        if (lVar9 < (long)sVar10) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (in_stack_fffffffffffffb40,(size_type)in_stack_fffffffffffffb38);
          in_stack_fffffffffffffb60 =
               std::operator<<((ostream *)&std::clog,"[warning] meta data size error.");
          std::ostream::operator<<(in_stack_fffffffffffffb60,std::endl<char,std::char_traits<char>>)
          ;
        }
        in_stack_fffffffffffffb58 = local_98;
        local_2ac = (uint)local_261;
        std::
        make_shared<rlib::midi::EventMeta,rlib::midi::EventMeta::Type,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Type *)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
        in_stack_fffffffffffffb50 =
             std::
             multiset<rlib::midi::Smf::Event,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
             ::emplace<unsigned_long&,std::shared_ptr<rlib::midi::EventMeta>>
                       ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                         *)in_stack_fffffffffffffb28,(unsigned_long *)in_stack_fffffffffffffb20,
                        (shared_ptr<rlib::midi::EventMeta> *)in_stack_fffffffffffffb18);
        local_2b8 = in_stack_fffffffffffffb50._M_node;
        std::shared_ptr<rlib::midi::EventMeta>::~shared_ptr
                  ((shared_ptr<rlib::midi::EventMeta> *)0x1e03da);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb30);
      }
    }
    std::__cxx11::list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::
    emplace_back<rlib::midi::Smf::Track>
              ((list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *)
               in_stack_fffffffffffffb30,(Track *)in_stack_fffffffffffffb28);
    Track::~Track((Track *)0x1e04ae);
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

Smf Smf::fromStream(std::istream& is)
{
	using namespace midi;

	Smf smf;

	const auto headerChunk = [&is]() {
		Inner::HeaderChunk c = Inner::read<decltype(c)>(is);
		if (c.MThd != Inner::HeaderChunk().MThd) {
			throw std::runtime_error("MThd chunk error");
		}
		Inner::changeEndian(c.dataLength);
		Inner::changeEndian(c.format);
		Inner::changeEndian(c.trackCount);
		Inner::changeEndian(c.division);
		return c;
	}();

	smf.timeBase = headerChunk.division;

	// トラックチャンク
	std::exception_ptr ep;	// 例外保持
	try {
		for (size_t i = 0; i < headerChunk.trackCount; i++) {
			const auto trackChunk = [&is]() {
				Inner::TrackChunk c = Inner::read<decltype(c)>(is);
				if (c.MTrk != Inner::TrackChunk().MTrk) {
					throw std::runtime_error("MTrk chunk error.");
				}
				Inner::changeEndian(c.dataLength);
				return c;
			}();

			Smf::Track track;
			try{
				std::uint64_t currentPosition = 0;		// 現在位置
				uint8_t beforeStatus = 0;
				for (const auto beginPosition = is.tellg(); is.tellg() - beginPosition < trackChunk.dataLength; ) {
					auto readVariableValue = [&is] {					// 可変長数値を取得
						return inner::readVariableValue([&] {return Inner::read<uint8_t>(is); });
					};

					currentPosition += readVariableValue();		// 現在位置 += デルタタイム

					// status 読み込み
					const auto status = [&] {
						const uint8_t status = Inner::read<decltype(status)>(is);
						if (!(status & 0x80)) {					// status 省略なら直前値を採用
							is.seekg(-1, std::ios::cur);		// 位置を戻す
							return beforeStatus;
						}
						beforeStatus = status;
						return status;
					}();

					switch (status & 0xf0) {
					case EventNoteOff::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventNoteOff>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventNoteOn::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventNoteOn>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventPolyphonicKeyPressure::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventPolyphonicKeyPressure>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventControlChange::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventControlChange>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventProgramChange::statusByte: {
						const uint8_t n = Inner::read<decltype(n)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventProgramChange>(status & 0xf, n & 0x7f));
						break;
					}
					case EventPitchBend::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						const auto n = ((a[0] & 0x7f) + (a[1] & 0x7f) * 0x80) - 8192;
						track.events.emplace(currentPosition, std::make_shared<EventPitchBend>(status & 0xf, n));
						break;
					}
					case EventChannelPressure::statusByte: {
						const uint8_t n = Inner::read<decltype(n)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventChannelPressure>(status & 0xf, n & 0x7f));
						break;
					}
					default:
						switch (status) {
						case EventExclusive::statusByte: {
							const auto size = readVariableValue();		// データ長
							std::vector<uint8_t> data;
							for (auto i = 0; i < size; i++) {
								const uint8_t n = Inner::read<decltype(n)>(is);
								if (n == 0xf7) {				// EOX(終了コード)
									if (i != size - 1) {
										// ヘンなところで終わった(が、エラーにはせず続行)
										std::clog << "[warning] exclusive size error. EOX(0xf7) is failed position." << std::endl;	// throw std::runtime_error("exclusive size error");
										break;
									}
									break;
								}
								if ((n & 0x80) != 0) {
									// あるべきハズのEOX(0xf7)が無い(が、エラーにはせず続行)
									std::clog << "[warning] exclusive data error. EOX(0xf7) is missing." << std::endl;
									break;
								}
								data.push_back(n);
							}
							track.events.emplace(currentPosition, std::make_shared<EventExclusive>(std::move(data)));
							break;
						}
						case EventMeta::statusByte: {
							const uint8_t type = Inner::read<decltype(type)>(is);					// イベントタイプ
							const auto len = readVariableValue();									// データ長
							std::vector<uint8_t> data(len);
							if (const auto readed = is.read(reinterpret_cast<char*>(data.data()), data.size()).gcount(); readed < static_cast<std::intmax_t>(data.size())) {
								data.resize(readed);
								// データが足りない(が、エラーにはせず続行)
								std::clog << "[warning] meta data size error." << std::endl;
							}
							track.events.emplace(currentPosition, std::make_shared<EventMeta>(static_cast<EventMeta::Type>(type), std::move(data)));
							break;
						}
						default:
							assert(false);
							break;
						}
					}
				}
			} catch (...) {
				if (track.events.size() > 0) {
					smf.tracks.emplace_back(std::move(track));
				}
				throw;
			}
			smf.tracks.emplace_back(std::move(track));
		}
	} catch (...) {
		ep = std::current_exception();
	}
	if (ep) {
		try {
			std::rethrow_exception(ep);
		} catch (const std::exception& e) {
			std::clog << "[warning] exception: " << e.what() << std::endl;
		} catch (...) {
			std::clog << "[warning] exception unknwon" << std::endl;
		}
		if (smf.tracks.size() <= 0) {	// トラックがまったくパースできてない状態なら
			std::rethrow_exception(ep);	// throw で終了
		}
	}
	return smf;
}